

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_set_column.h
# Opt level: O0

Entry * __thiscall
Gudhi::persistence_matrix::
Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
::_insert_entry(Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
                *this,Field_element *value,ID_index rowIndex,iterator *position)

{
  undefined1 local_40 [16];
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  *local_30;
  Entry *newEntry;
  iterator *position_local;
  Field_element *pFStack_18;
  ID_index rowIndex_local;
  Field_element *value_local;
  Intrusive_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  *this_local;
  
  newEntry = (Entry *)position;
  position_local._4_4_ = rowIndex;
  pFStack_18 = value;
  value_local = (Field_element *)this;
  local_30 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>>
             ::construct<unsigned_int&,unsigned_int&>
                       ((New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)8,true,true,false>>>>
                         *)this->entryPool_,(uint *)this,(uint *)((long)&position_local + 4));
  Entry_field_element<unsigned_int>::set_element
            (&local_30->super_Entry_field_element_option,pFStack_18);
  boost::intrusive::
  tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>::Matrix_column_tag,_3U>,_true>
  ::tree_iterator((tree_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>::Matrix_column_tag,_3U>,_true>
                   *)(local_40 + 8),(nonconst_iterator *)newEntry);
  boost::intrusive::
  set_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
  ::insert((set_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>,_boost::intrusive::rbtree_node_traits<void_*,_false>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>::Matrix_column_tag,_3U>,_void,_void,_unsigned_long,_false,_void>
            *)local_40,(const_iterator *)&this->column_,(reference)(local_40 + 8));
  Row_access<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)8,_true,_true,_false>_>_>
  ::insert_entry(&this->super_Row_access_option,position_local._4_4_,local_30);
  return local_30;
}

Assistant:

inline typename Intrusive_set_column<Master_matrix>::Entry* Intrusive_set_column<Master_matrix>::_insert_entry(
    const Field_element& value,
    ID_index rowIndex,
    const iterator& position)
{
  if constexpr (Master_matrix::Option_list::has_row_access) {
    Entry* newEntry = entryPool_->construct(RA_opt::columnIndex_, rowIndex);
    newEntry->set_element(value);
    column_.insert(position, *newEntry);
    RA_opt::insert_entry(rowIndex, newEntry);
    return newEntry;
  } else {
    Entry* newEntry = entryPool_->construct(rowIndex);
    newEntry->set_element(value);
    column_.insert(position, *newEntry);
    return newEntry;
  }
}